

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

ManagedType __thiscall cmGeneratorTarget::GetManagedType(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  ImportInfo *pIVar3;
  string *propval;
  allocator<char> local_51;
  string local_50;
  cmValue local_30;
  cmValue clr;
  ImportInfo *info;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  TVar2 = GetType(this);
  if ((int)TVar2 < 3) {
    TVar2 = GetType(this);
    if (TVar2 == STATIC_LIBRARY) {
      this_local._4_4_ = Native;
    }
    else {
      bVar1 = IsImported(this);
      if (bVar1) {
        pIVar3 = GetImportInfo(this,config);
        if (pIVar3 == (ImportInfo *)0x0) {
          this_local._4_4_ = Undefined;
        }
        else {
          this_local._4_4_ = pIVar3->Managed;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"COMMON_LANGUAGE_RUNTIME",&local_51);
        local_30 = GetProperty(this,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::allocator<char>::~allocator(&local_51);
        bVar1 = cmValue::operator_cast_to_bool(&local_30);
        if (bVar1) {
          propval = cmValue::operator*[abi_cxx11_(&local_30);
          this_local._4_4_ = CheckManagedType(this,propval);
        }
        else {
          bVar1 = IsCSharpOnly(this);
          this_local._4_4_ = Native;
          if (bVar1) {
            this_local._4_4_ = Managed;
          }
        }
      }
    }
  }
  else {
    this_local._4_4_ = Undefined;
  }
  return this_local._4_4_;
}

Assistant:

cmGeneratorTarget::ManagedType cmGeneratorTarget::GetManagedType(
  const std::string& config) const
{
  // Only libraries and executables can be managed targets.
  if (this->GetType() > cmStateEnums::SHARED_LIBRARY) {
    return ManagedType::Undefined;
  }

  if (this->GetType() == cmStateEnums::STATIC_LIBRARY) {
    return ManagedType::Native;
  }

  // Check imported target.
  if (this->IsImported()) {
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      return info->Managed;
    }
    return ManagedType::Undefined;
  }

  // Check for explicitly set clr target property.
  if (cmValue clr = this->GetProperty("COMMON_LANGUAGE_RUNTIME")) {
    return this->CheckManagedType(*clr);
  }

  // C# targets are always managed. This language specific check
  // is added to avoid that the COMMON_LANGUAGE_RUNTIME target property
  // has to be set manually for C# targets.
  return this->IsCSharpOnly() ? ManagedType::Managed : ManagedType::Native;
}